

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrystalMine.hpp
# Opt level: O2

void __thiscall CrystalMine::~CrystalMine(CrystalMine *this)

{
  ~CrystalMine(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

virtual ~CrystalMine() {}